

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall Am_Object::Note_Unchanged(Am_Object *this,Am_Slot_Key key)

{
  if ((this->data != (Am_Object_Data *)0x0) && ((this->data->data).data != (char *)0x0)) {
    (*cc->_vptr_Am_Constraint_Context[4])(cc,this,key,cc->_vptr_Am_Constraint_Context[4]);
    return;
  }
  (*cc->_vptr_Am_Constraint_Context[5])
            (cc,&Get_On_Null_Object_Value,this,key,0,"Note_Unchanged called on (0L) object");
  return;
}

Assistant:

void
Am_Object::Note_Unchanged(Am_Slot_Key key)
{
  if (!data || !data->data.data)
    cc->Raise_Get_Exception(Get_On_Null_Object_Value,
                            (const Am_Object_Advanced &)*this, key, 0,
                            "Note_Unchanged called on (0L) object");
  else
    cc->Note_Unchanged((const Am_Object_Advanced &)*this, key);
}